

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player.c
# Opt level: O3

panel * get_panel_topleft(void)

{
  panel *p;
  panel_line *ppVar1;
  char *pcVar2;
  
  p = (panel *)mem_zalloc(0x18);
  p->len = 0;
  p->max = 6;
  ppVar1 = (panel_line *)mem_zalloc(0xf0);
  p->lines = ppVar1;
  panel_line(p,'\x0e',"Name","%s",player->full_name);
  panel_line(p,'\x0e',"Race","%s",player->race->name);
  panel_line(p,'\x0e',"Class","%s",player->class->name);
  if (player->wizard == false) {
    pcVar2 = "***WINNER***";
    if ((player->total_winner == 0) && (player->lev < 0x33)) {
      pcVar2 = player->class->title[(player->lev + -1) / 5];
    }
  }
  else {
    pcVar2 = "[=-WIZARD-=]";
  }
  panel_line(p,'\x0e',"Title","%s",pcVar2);
  panel_line(p,'\x0e',"HP","%d/%d",(ulong)(uint)(int)player->chp,(ulong)(uint)(int)player->mhp);
  panel_line(p,'\x0e',"SP","%d/%d",(ulong)(uint)(int)player->csp,(ulong)(uint)(int)player->msp);
  return p;
}

Assistant:

static struct panel *get_panel_topleft(void) {
	struct panel *p = panel_allocate(6);

	panel_line(p, COLOUR_L_BLUE, "Name", "%s", player->full_name);
	panel_line(p, COLOUR_L_BLUE, "Race",	"%s", player->race->name);
	panel_line(p, COLOUR_L_BLUE, "Class", "%s", player->class->name);
	panel_line(p, COLOUR_L_BLUE, "Title", "%s", show_title());
	panel_line(p, COLOUR_L_BLUE, "HP", "%d/%d", player->chp, player->mhp);
	panel_line(p, COLOUR_L_BLUE, "SP", "%d/%d", player->csp, player->msp);

	return p;
}